

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statzone.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  __ssize_t _Var4;
  char *pcVar5;
  char *pcVar6;
  ostream *poVar7;
  allocator local_111;
  char *linebuffer;
  size_t linesize;
  string domain;
  string previous_domain;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unique_ns;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  signed_domains;
  value_type local_50;
  
  signed_domains._M_h._M_buckets = &signed_domains._M_h._M_single_bucket;
  signed_domains._M_h._M_bucket_count = 1;
  signed_domains._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  signed_domains._M_h._M_element_count = 0;
  signed_domains._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  signed_domains._M_h._M_rehash_policy._M_next_resize = 0;
  signed_domains._M_h._M_single_bucket = (__node_base_ptr)0x0;
  unique_ns._M_h._M_buckets = &unique_ns._M_h._M_single_bucket;
  unique_ns._M_h._M_bucket_count = 1;
  linebuffer = (char *)0x0;
  unique_ns._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  unique_ns._M_h._M_element_count = 0;
  linesize = 0;
  unique_ns._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  unique_ns._M_h._M_rehash_policy._M_next_resize = 0;
  unique_ns._M_h._M_single_bucket = (__node_base_ptr)0x0;
  domain._M_dataplus._M_p = (pointer)&domain.field_2;
  domain._M_string_length = 0;
  previous_domain._M_dataplus._M_p = (pointer)&previous_domain.field_2;
  previous_domain._M_string_length = 0;
  domain.field_2._M_local_buf[0] = '\0';
  previous_domain.field_2._M_local_buf[0] = '\0';
  do {
    iVar2 = getopt(argc,argv,"hv");
    if (iVar2 == -1) {
      if (_optind < argc) {
        pcVar5 = argv[_optind];
        begin.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        if (((*pcVar5 == '-') && (__stream = _stdin, pcVar5[1] == '\0')) ||
           (__stream = fopen(pcVar5,"r"), __stream != (FILE *)0x0)) {
          goto LAB_001024df;
        }
        perror("Can\'t open zone file");
        iVar2 = 1;
        goto LAB_0010292c;
      }
      break;
    }
    if (iVar2 == 0x76) {
      puts("StatZone 1.1.2");
      goto LAB_0010292a;
    }
  } while (iVar2 != 0x68);
  usage();
LAB_0010292a:
  iVar2 = 0;
LAB_0010292c:
  std::__cxx11::string::~string((string *)&previous_domain);
  std::__cxx11::string::~string((string *)&domain);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&unique_ns._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&signed_domains._M_h);
  return iVar2;
LAB_001024df:
  do {
    _Var4 = getline(&linebuffer,&linesize,__stream);
    if (_Var4 == -1) {
      if (results.domains != 0) {
        results.domains = results.domains - 1;
      }
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "---[ CSV values ]--------------------------------------------------------------"
                              );
      std::endl<char,std::char_traits<char>>(poVar7);
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "IPv4 Glue,IPv6 Glue,NS,Unique NS,DS,Signed,IDNs,Domains");
      std::endl<char,std::char_traits<char>>(poVar7);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar7,",");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar7,",");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar7,",");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar7,",");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar7,",");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar7,",");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar7,",");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::endl<char,std::char_traits<char>>(poVar7);
      current.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      poVar7 = std::operator<<((ostream *)&std::cerr,"Processed ");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::operator<<(poVar7," lines in ");
      std::ostream::_M_insert<double>
                ((double)(((long)current.__d.__r - (long)begin.__d.__r) / 1000) / 1000000.0);
      poVar7 = std::operator<<((ostream *)&std::cerr," seconds.");
      std::endl<char,std::char_traits<char>>(poVar7);
      free(linebuffer);
      fclose(__stream);
      goto LAB_0010292a;
    }
  } while (((ulong)(byte)*linebuffer < 0x3c) &&
          ((0x800001000000001U >> ((ulong)(byte)*linebuffer & 0x3f) & 1) != 0));
  pcVar5 = strtok(linebuffer," \t");
  if (pcVar5 != (char *)0x0) {
    strtolower(pcVar5);
    std::__cxx11::string::assign((char *)&domain);
  }
  iVar2 = 0;
LAB_00102544:
  do {
    pcVar6 = pcVar5;
    if (pcVar6 == (char *)0x0) break;
    pcVar5 = (char *)0x0;
    if (*pcVar6 != ';') {
      pcVar6 = strtolower(pcVar6);
      if (iVar2 == 0) {
LAB_00102615:
        cVar1 = *pcVar6;
      }
      else {
        iVar3 = strcmp(pcVar6,"nsec");
        pcVar5 = (char *)0x0;
        if (iVar3 == 0) goto LAB_00102544;
        iVar3 = strcmp(pcVar6,"nsec3");
        pcVar5 = (char *)0x0;
        if (iVar3 == 0) goto LAB_00102544;
        iVar3 = strcmp(pcVar6,"rrsig");
        pcVar5 = (char *)0x0;
        if (iVar3 == 0) goto LAB_00102544;
        if ((*pcVar6 == 'a') && (pcVar6[1] == '\0')) {
          results.a = results.a + 1;
        }
        iVar3 = strcmp(pcVar6,"aaaa");
        if (iVar3 == 0) {
          results.aaaa = results.aaaa + 1;
        }
        cVar1 = *pcVar6;
        if (cVar1 == 'd') {
          if ((pcVar6[1] == 's') && (pcVar6[2] == '\0')) {
            results.ds = results.ds + 1;
            std::__detail::
            _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)&signed_domains,&domain);
          }
          goto LAB_00102615;
        }
      }
      if (((cVar1 == 'n') && (pcVar6[1] == 's')) && (pcVar6[2] == '\0')) {
        results.ns = results.ns + 1;
        iVar3 = std::__cxx11::string::compare((string *)&domain);
        if (iVar3 != 0) {
          results.domains = results.domains + 1;
          std::__cxx11::string::_M_assign((string *)&previous_domain);
          iVar3 = std::__cxx11::string::compare((ulong)&domain,0,(char *)0x4);
          if (iVar3 == 0) {
            results.idn = results.idn + 1;
          }
        }
        pcVar5 = strtok((char *)0x0,"\n");
        if ((pcVar5 != (char *)0x0) &&
           ((pcVar6 = strchr(pcVar5,0x20), pcVar6 == (char *)0x0 ||
            (pcVar5 = strtok((char *)0x0,"\n"), pcVar5 != (char *)0x0)))) {
          std::__cxx11::string::string((string *)&local_50,pcVar5,&local_111);
          std::__detail::
          _Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
          ::insert((_Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                    *)&unique_ns,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      pcVar5 = strtok((char *)0x0," \t");
      iVar2 = iVar2 + 1;
    }
  } while( true );
  results.processedLines = results.processedLines + 1;
  goto LAB_001024df;
}

Assistant:

int
main(int argc, char *argv[])
{
	std::unordered_set<std::string> signed_domains;
	std::unordered_set<std::string> unique_ns;

	int opt, token_count;

	char *linebuffer = NULL;
	size_t linesize = 0;

	char *input;
	std::string domain, previous_domain;
	char *rdata, *token = nullptr, *token_lc = nullptr;

	FILE *zonefile;

#ifdef HAVE_SECCOMP
	if (prctl(PR_SET_NO_NEW_PRIVS, 1, 0, 0, 0)) {
		perror("Can't initialize seccomp");
		return EXIT_FAILURE;
	}

	if (prctl(PR_SET_SECCOMP, SECCOMP_MODE_FILTER, &statzone)) {
		perror("Can't load seccomp filter");
		return EXIT_FAILURE;
	}
#endif

#ifdef SIGINFO
	signal(SIGINFO, siginfo_handler);
#endif

	while ((opt = getopt(argc, argv, "hv")) != -1) {
		switch (opt) {

		case 'h':
			usage();
			return EXIT_SUCCESS;

		case 'v':
			printf("%s\n", VERSION);
			return EXIT_SUCCESS;
		}
	}

	if (optind < argc) {
		input = argv[optind];
	} else {
		usage();
		return EXIT_SUCCESS;
	}

	/* Starting timer */
	begin = std::chrono::steady_clock::now();

	/* Open zone file */
	if (!strcmp(input, "-")) {
		/* Read from standard input */
		zonefile = stdin;
	} else {
		/* Attempt to read from file */
		if (!(zonefile = fopen(input, "r"))) {
			perror("Can't open zone file");
			return EXIT_FAILURE;
		}
	}

	while (getline(&linebuffer, &linesize, zonefile) != -1) {
		if (!*linebuffer)
			continue;

		if (*linebuffer == ';') /* Comments */
			continue;

		if (*linebuffer == '$') /* Directives */
			continue;

		token_count = 0;
		token = strtok(linebuffer, " \t");

		if (token)
			domain = strtolower(token);

		while (token) {
			if (*token == ';') { /* Comments */
				token = nullptr;
				continue;
			}

			token_lc = strtolower(token);
			if (token_count && !strcmp(token_lc, "nsec")) {
				token = nullptr;
				continue;
			}

			if (token_count && !strcmp(token_lc, "nsec3")) {
				token = nullptr;
				continue;
			}

			if (token_count && !strcmp(token_lc, "rrsig")) {
				token = nullptr;
				continue;
			}

			if (token_count && !strcmp(token_lc, "a"))
				results.a++;

			if (token_count && !strcmp(token_lc, "aaaa"))
				results.aaaa++;

			if (token_count && !strcmp(token_lc, "ds")) {
				results.ds++;

				signed_domains.insert(domain);
			}

			if (!strcmp(token_lc, "ns")) {
				results.ns++;

				if (domain.compare(previous_domain)) {
					results.domains++;

					previous_domain = domain;

					if (!domain.compare(0, 4, "xn--"))
						results.idn++;
				}

				rdata = strtok(nullptr, "\n");

				if (rdata && strchr(rdata, ' '))
					rdata = strtok(nullptr, "\n");

				if (rdata)
					unique_ns.insert(rdata);
			}

			token = strtok(nullptr, " \t");
			token_count++;
		}

		results.processedLines++;
	}

	/* Don't count origin */
	if (results.domains)
		results.domains--;

	/* Printing CVS values */
	std::cout << "---[ CSV values ]--------------------------------------------------------------" << std::endl;
	std::cout << "IPv4 Glue,IPv6 Glue,NS,Unique NS,DS,Signed,IDNs,Domains" << std::endl;
	std::cout << results.a << ",";
	std::cout << results.aaaa << ",";
	std::cout << results.ns << ",";
	std::cout << unique_ns.size() << ",";
	std::cout << results.ds << ",";
	std::cout << signed_domains.size() << ",";
	std::cout << results.idn << ",";
	std::cout << results.domains << std::endl;

	/* Printing results */
	summary();

	/* Clean up */
	free(linebuffer);
	fclose(zonefile);

	return EXIT_SUCCESS;
}